

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

NewOrderSingle * __thiscall
Application::queryNewOrderSingle43(NewOrderSingle *__return_storage_ptr__,Application *this)

{
  char cVar1;
  Application *pAVar2;
  OrdType ordType;
  Application local_221;
  FieldBase local_1c8;
  FieldBase local_170;
  FieldBase local_118;
  FieldBase local_c0;
  FieldBase local_68;
  
  pAVar2 = this;
  FIX::OrdType::OrdType((OrdType *)&local_1c8);
  queryClOrdID((ClOrdID *)((long)&local_221.super_Application._vptr_Application + 1),pAVar2);
  pAVar2 = &local_221;
  local_221.super_Application._vptr_Application._0_1_ = 0x31;
  FIX::HandlInst::HandlInst((HandlInst *)&local_68,(CHAR *)pAVar2);
  querySide((Side *)&local_c0,pAVar2);
  FIX::TransactTime::TransactTime((TransactTime *)&local_118);
  queryOrdType((OrdType *)&local_170,pAVar2);
  FIX::FieldBase::operator=(&local_1c8,&local_170);
  pAVar2 = (Application *)((long)&local_221.super_Application._vptr_Application + 1);
  FIX43::NewOrderSingle::NewOrderSingle
            (__return_storage_ptr__,(ClOrdID *)pAVar2,(HandlInst *)&local_68,(Side *)&local_c0,
             (TransactTime *)&local_118,(OrdType *)&local_1c8);
  FIX::FieldBase::~FieldBase(&local_170);
  FIX::FieldBase::~FieldBase(&local_118);
  FIX::FieldBase::~FieldBase(&local_c0);
  FIX::FieldBase::~FieldBase(&local_68);
  FIX::FieldBase::~FieldBase
            ((FieldBase *)((long)&local_221.super_Application._vptr_Application + 1));
  querySymbol((Symbol *)((long)&local_221.super_Application._vptr_Application + 1),pAVar2);
  pAVar2 = (Application *)((long)&local_221.super_Application._vptr_Application + 1);
  FIX43::NewOrderSingle::set(__return_storage_ptr__,(Symbol *)pAVar2);
  FIX::FieldBase::~FieldBase
            ((FieldBase *)((long)&local_221.super_Application._vptr_Application + 1));
  queryOrderQty((OrderQty *)((long)&local_221.super_Application._vptr_Application + 1),pAVar2);
  pAVar2 = (Application *)((long)&local_221.super_Application._vptr_Application + 1);
  FIX43::NewOrderSingle::set(__return_storage_ptr__,(OrderQty *)pAVar2);
  FIX::FieldBase::~FieldBase
            ((FieldBase *)((long)&local_221.super_Application._vptr_Application + 1));
  queryTimeInForce((TimeInForce *)((long)&local_221.super_Application._vptr_Application + 1),pAVar2)
  ;
  pAVar2 = (Application *)((long)&local_221.super_Application._vptr_Application + 1);
  FIX43::NewOrderSingle::set(__return_storage_ptr__,(TimeInForce *)pAVar2);
  FIX::FieldBase::~FieldBase
            ((FieldBase *)((long)&local_221.super_Application._vptr_Application + 1));
  cVar1 = FIX::CharField::getValue((CharField *)&local_1c8);
  if (cVar1 == '2') {
LAB_0011ba9d:
    queryPrice((Price *)((long)&local_221.super_Application._vptr_Application + 1),pAVar2);
    pAVar2 = (Application *)((long)&local_221.super_Application._vptr_Application + 1);
    FIX43::NewOrderSingle::set(__return_storage_ptr__,(Price *)pAVar2);
    FIX::FieldBase::~FieldBase
              ((FieldBase *)((long)&local_221.super_Application._vptr_Application + 1));
  }
  else {
    cVar1 = FIX::CharField::getValue((CharField *)&local_1c8);
    if (cVar1 == '4') goto LAB_0011ba9d;
  }
  cVar1 = FIX::CharField::getValue((CharField *)&local_1c8);
  if (cVar1 != '3') {
    cVar1 = FIX::CharField::getValue((CharField *)&local_1c8);
    if (cVar1 != '4') goto LAB_0011bafb;
  }
  queryStopPx((StopPx *)((long)&local_221.super_Application._vptr_Application + 1),pAVar2);
  FIX43::NewOrderSingle::set
            (__return_storage_ptr__,
             (StopPx *)((long)&local_221.super_Application._vptr_Application + 1));
  FIX::FieldBase::~FieldBase
            ((FieldBase *)((long)&local_221.super_Application._vptr_Application + 1));
LAB_0011bafb:
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  FIX::FieldBase::~FieldBase(&local_1c8);
  return __return_storage_ptr__;
}

Assistant:

FIX43::NewOrderSingle Application::queryNewOrderSingle43() {
  FIX::OrdType ordType;

  FIX43::NewOrderSingle
      newOrderSingle(queryClOrdID(), FIX::HandlInst('1'), querySide(), FIX::TransactTime(), ordType = queryOrdType());

  newOrderSingle.set(querySymbol());
  newOrderSingle.set(queryOrderQty());
  newOrderSingle.set(queryTimeInForce());
  if (ordType == FIX::OrdType_LIMIT || ordType == FIX::OrdType_STOP_LIMIT) {
    newOrderSingle.set(queryPrice());
  }
  if (ordType == FIX::OrdType_STOP || ordType == FIX::OrdType_STOP_LIMIT) {
    newOrderSingle.set(queryStopPx());
  }

  queryHeader(newOrderSingle.getHeader());
  return newOrderSingle;
}